

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addBinaryMath
          (TIntermediate *this,TOperator op,TIntermTyped *left,TIntermTyped *right,TSourceLoc *loc)

{
  TSourceLoc *pTVar1;
  bool bVar2;
  int iVar3;
  TBasicType TVar4;
  TOperator TVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TType *pTVar8;
  undefined4 extraout_var_03;
  __tuple_element_t<0UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_> *ppTVar9;
  __tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_> *ppTVar10;
  TIntermBinary *node_00;
  long *plVar11;
  long lVar12;
  TIntermTyped *pTVar13;
  TIntermTyped *node2;
  TQualifier *pTVar14;
  TIntermTyped *folded;
  TIntermConstantUnion *rightTempConstant;
  TIntermConstantUnion *leftTempConstant;
  TIntermBinary *node;
  tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> children;
  TIntermTyped *node_3;
  TType local_368;
  TType local_2d0;
  TType local_238;
  TIntermConstantUnion *local_1a0;
  TIntermConstantUnion *size_2;
  TIntermTyped *node_2;
  TIntermConstantUnion *local_f8;
  TIntermConstantUnion *size_1;
  TType *referenceType_1;
  TIntermTyped *node_1;
  TIntermConstantUnion *local_48;
  TIntermConstantUnion *size;
  TType *referenceType;
  TSourceLoc *loc_local;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TIntermediate *pTStack_18;
  TOperator op_local;
  TIntermediate *this_local;
  
  referenceType = (TType *)loc;
  loc_local = (TSourceLoc *)right;
  right_local = left;
  left_local._4_4_ = op;
  pTStack_18 = this;
  iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))();
  if (iVar3 == 0x10) {
    return (TIntermTyped *)0x0;
  }
  plVar6 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
  iVar3 = (**(code **)(*plVar6 + 0x38))();
  if (iVar3 == 0x10) {
    return (TIntermTyped *)0x0;
  }
  if ((left_local._4_4_ == EOpAdd) || (left_local._4_4_ == EOpSub)) {
    bVar2 = TIntermTyped::isReference(right_local);
    if (bVar2) {
      iVar3 = (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xa8))();
      uVar7 = (**(code **)(*plVar6 + 0x1a8))();
      if ((uVar7 & 1) != 0) {
        return (TIntermTyped *)0x0;
      }
    }
    bVar2 = TIntermTyped::isReference((TIntermTyped *)loc_local);
    if (bVar2) {
      plVar6 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      plVar6 = (long *)(**(code **)(*plVar6 + 0xa8))();
      uVar7 = (**(code **)(*plVar6 + 0x1a8))();
      if ((uVar7 & 1) != 0) {
        return (TIntermTyped *)0x0;
      }
    }
    bVar2 = TIntermTyped::isReference(right_local);
    if (bVar2) {
      TVar4 = (*(code *)loc_local->name[6]._M_string_length)();
      bVar2 = isTypeInt(TVar4);
      if (bVar2) {
        iVar3 = (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        size = (TIntermConstantUnion *)CONCAT44(extraout_var_01,iVar3);
        iVar3 = (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        iVar3 = computeBufferReferenceTypeSize((TType *)CONCAT44(extraout_var_02,iVar3));
        local_48 = addConstantUnion(this,(long)iVar3,(TSourceLoc *)referenceType,true);
        pTVar13 = right_local;
        pTVar8 = referenceType;
        TType::TType((TType *)&node_1,EbtUint64,EvqTemporary,1,0,0,false);
        right_local = addBuiltInFunctionCall
                                (this,(TSourceLoc *)pTVar8,EOpConvPtrToUint64,true,
                                 &pTVar13->super_TIntermNode,(TType *)&node_1);
        TType::~TType((TType *)&node_1);
        loc_local = (TSourceLoc *)createConversion(this,EbtInt64,(TIntermTyped *)loc_local);
        loc_local = (TSourceLoc *)
                    addBinaryMath(this,EOpMul,(TIntermTyped *)loc_local,
                                  &local_48->super_TIntermTyped,(TSourceLoc *)referenceType);
        referenceType_1 =
             (TType *)addBinaryMath(this,left_local._4_4_,right_local,(TIntermTyped *)loc_local,
                                    (TSourceLoc *)referenceType);
        pTVar13 = addBuiltInFunctionCall
                            (this,(TSourceLoc *)referenceType,EOpConvUint64ToPtr,true,
                             (TIntermNode *)referenceType_1,(TType *)size);
        return pTVar13;
      }
    }
  }
  if ((left_local._4_4_ == EOpAdd) &&
     (bVar2 = TIntermTyped::isReference((TIntermTyped *)loc_local), bVar2)) {
    TVar4 = (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x20])();
    bVar2 = isTypeInt(TVar4);
    if (bVar2) {
      size_1 = (TIntermConstantUnion *)
               (*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      pTVar8 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      iVar3 = computeBufferReferenceTypeSize(pTVar8);
      local_f8 = addConstantUnion(this,(long)iVar3,(TSourceLoc *)referenceType,true);
      pTVar1 = loc_local;
      pTVar8 = referenceType;
      TType::TType((TType *)&node_2,EbtUint64,EvqTemporary,1,0,0,false);
      loc_local = (TSourceLoc *)
                  addBuiltInFunctionCall
                            (this,(TSourceLoc *)pTVar8,EOpConvPtrToUint64,true,(TIntermNode *)pTVar1
                             ,(TType *)&node_2);
      TType::~TType((TType *)&node_2);
      right_local = createConversion(this,EbtInt64,right_local);
      right_local = addBinaryMath(this,EOpMul,right_local,&local_f8->super_TIntermTyped,
                                  (TSourceLoc *)referenceType);
      size_2 = (TIntermConstantUnion *)
               addBinaryMath(this,left_local._4_4_,right_local,(TIntermTyped *)loc_local,
                             (TSourceLoc *)referenceType);
      pTVar13 = addBuiltInFunctionCall
                          (this,(TSourceLoc *)referenceType,EOpConvUint64ToPtr,true,
                           (TIntermNode *)size_2,(TType *)size_1);
      return pTVar13;
    }
  }
  if (((left_local._4_4_ == EOpSub) && (bVar2 = TIntermTyped::isReference(right_local), bVar2)) &&
     (bVar2 = TIntermTyped::isReference((TIntermTyped *)loc_local), bVar2)) {
    iVar3 = (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar3 = computeBufferReferenceTypeSize((TType *)CONCAT44(extraout_var_03,iVar3));
    local_1a0 = addConstantUnion(this,(long)iVar3,(TSourceLoc *)referenceType,true);
    pTVar13 = right_local;
    pTVar8 = referenceType;
    TType::TType(&local_238,EbtUint64,EvqTemporary,1,0,0,false);
    right_local = addBuiltInFunctionCall
                            (this,(TSourceLoc *)pTVar8,EOpConvPtrToUint64,true,
                             &pTVar13->super_TIntermNode,&local_238);
    TType::~TType(&local_238);
    pTVar1 = loc_local;
    pTVar8 = referenceType;
    TType::TType(&local_2d0,EbtUint64,EvqTemporary,1,0,0,false);
    loc_local = (TSourceLoc *)
                addBuiltInFunctionCall
                          (this,(TSourceLoc *)pTVar8,EOpConvPtrToUint64,true,(TIntermNode *)pTVar1,
                           &local_2d0);
    TType::~TType(&local_2d0);
    pTVar13 = right_local;
    pTVar8 = referenceType;
    TType::TType(&local_368,EbtInt64,EvqTemporary,1,0,0,false);
    right_local = addBuiltInFunctionCall
                            (this,(TSourceLoc *)pTVar8,EOpConvNumeric,true,
                             &pTVar13->super_TIntermNode,&local_368);
    TType::~TType(&local_368);
    pTVar1 = loc_local;
    pTVar8 = referenceType;
    TType::TType((TType *)&node_3,EbtInt64,EvqTemporary,1,0,0,false);
    loc_local = (TSourceLoc *)
                addBuiltInFunctionCall
                          (this,(TSourceLoc *)pTVar8,EOpConvNumeric,true,(TIntermNode *)pTVar1,
                           (TType *)&node_3);
    TType::~TType((TType *)&node_3);
    right_local = addBinaryMath(this,EOpSub,right_local,(TIntermTyped *)loc_local,
                                (TSourceLoc *)referenceType);
    pTVar13 = addBinaryMath(this,EOpDiv,right_local,&local_1a0->super_TIntermTyped,
                            (TSourceLoc *)referenceType);
    return pTVar13;
  }
  bVar2 = TIntermTyped::isReference(right_local);
  if ((bVar2) || (bVar2 = TIntermTyped::isReference((TIntermTyped *)loc_local), bVar2)) {
    return (TIntermTyped *)0x0;
  }
  addPairConversion((TIntermediate *)&node,(TOperator)this,(TIntermTyped *)(ulong)left_local._4_4_,
                    right_local);
  ppTVar9 = std::get<0ul,glslang::TIntermTyped*,glslang::TIntermTyped*>
                      ((tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> *)&node);
  right_local = *ppTVar9;
  ppTVar10 = std::get<1ul,glslang::TIntermTyped*,glslang::TIntermTyped*>
                       ((tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> *)&node);
  loc_local = (TSourceLoc *)*ppTVar10;
  if ((right_local == (TIntermTyped *)0x0) ||
     ((__tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_>)loc_local ==
      (__tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_>)0x0)) {
    return (TIntermTyped *)0x0;
  }
  addBiShapeConversion(this,left_local._4_4_,&right_local,(TIntermTyped **)&loc_local);
  if ((right_local == (TIntermTyped *)0x0) || (loc_local == (TSourceLoc *)0x0)) {
    return (TIntermTyped *)0x0;
  }
  node_00 = addBinaryNode(this,left_local._4_4_,right_local,(TIntermTyped *)loc_local,
                          (TSourceLoc *)referenceType);
  bVar2 = promote(this,&node_00->super_TIntermOperator);
  if (!bVar2) {
    return (TIntermTyped *)0x0;
  }
  (**(code **)(*(long *)&node_00->super_TIntermOperator + 0x1a0))();
  plVar6 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 400))();
  plVar6 = (long *)(**(code **)(*plVar6 + 0x28))();
  plVar11 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 0x198))();
  lVar12 = (**(code **)(*plVar11 + 0x28))();
  if ((plVar6 != (long *)0x0) && (lVar12 != 0)) {
    TVar5 = TIntermOperator::getOp(&node_00->super_TIntermOperator);
    pTVar13 = (TIntermTyped *)(**(code **)(*plVar6 + 0x180))(plVar6,TVar5,lVar12);
    if (pTVar13 != (TIntermTyped *)0x0) {
      return pTVar13;
    }
  }
  pTVar13 = (TIntermTyped *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 400))();
  node2 = (TIntermTyped *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 0x198))();
  bVar2 = specConstantPropagates(this,pTVar13,node2);
  if ((bVar2) && (bVar2 = isSpecializationOperation(this,&node_00->super_TIntermOperator), bVar2)) {
    plVar6 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 0xf8))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar6 + 0x50))();
    TQualifier::makeSpecConstant(pTVar14);
  }
  plVar6 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 400))();
  pTVar14 = (TQualifier *)(**(code **)(*plVar6 + 0x108))();
  bVar2 = TQualifier::isNonUniform(pTVar14);
  if (!bVar2) {
    plVar6 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 0x198))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar6 + 0x108))();
    bVar2 = TQualifier::isNonUniform(pTVar14);
    if (!bVar2) {
      return (TIntermTyped *)node_00;
    }
  }
  TVar5 = TIntermOperator::getOp(&node_00->super_TIntermOperator);
  bVar2 = isNonuniformPropagating(this,TVar5);
  if (bVar2) {
    plVar6 = (long *)(**(code **)(*(long *)&node_00->super_TIntermOperator + 0xf8))();
    lVar12 = (**(code **)(*plVar6 + 0x50))();
    *(ulong *)(lVar12 + 8) = *(ulong *)(lVar12 + 8) & 0xfffffffdffffffff | 0x200000000;
    return (TIntermTyped *)node_00;
  }
  return (TIntermTyped *)node_00;
}

Assistant:

TIntermTyped* TIntermediate::addBinaryMath(TOperator op, TIntermTyped* left, TIntermTyped* right, const TSourceLoc& loc)
{
    // No operations work on blocks
    if (left->getType().getBasicType() == EbtBlock || right->getType().getBasicType() == EbtBlock)
        return nullptr;

    // Convert "reference +/- int" and "reference - reference" to integer math
    if (op == EOpAdd || op == EOpSub) {

        // No addressing math on struct with unsized array.
        if ((left->isReference() && left->getType().getReferentType()->containsUnsizedArray()) ||
            (right->isReference() && right->getType().getReferentType()->containsUnsizedArray())) {
            return nullptr;
        }

        if (left->isReference() && isTypeInt(right->getBasicType())) {
            const TType& referenceType = left->getType();
            TIntermConstantUnion* size = addConstantUnion((unsigned long long)computeBufferReferenceTypeSize(left->getType()), loc, true);
            left  = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, left, TType(EbtUint64));

            right = createConversion(EbtInt64, right);
            right = addBinaryMath(EOpMul, right, size, loc);

            TIntermTyped *node = addBinaryMath(op, left, right, loc);
            node = addBuiltInFunctionCall(loc, EOpConvUint64ToPtr, true, node, referenceType);
            return node;
        }
    }

    if (op == EOpAdd && right->isReference() && isTypeInt(left->getBasicType())) {
        const TType& referenceType = right->getType();
        TIntermConstantUnion* size =
            addConstantUnion((unsigned long long)computeBufferReferenceTypeSize(right->getType()), loc, true);
        right = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, right, TType(EbtUint64));

        left  = createConversion(EbtInt64, left);
        left  = addBinaryMath(EOpMul, left, size, loc);

        TIntermTyped *node = addBinaryMath(op, left, right, loc);
        node = addBuiltInFunctionCall(loc, EOpConvUint64ToPtr, true, node, referenceType);
        return node;
    }

    if (op == EOpSub && left->isReference() && right->isReference()) {
        TIntermConstantUnion* size =
            addConstantUnion((long long)computeBufferReferenceTypeSize(left->getType()), loc, true);

        left = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, left, TType(EbtUint64));
        right = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, right, TType(EbtUint64));

        left = addBuiltInFunctionCall(loc, EOpConvNumeric, true, left, TType(EbtInt64));
        right = addBuiltInFunctionCall(loc, EOpConvNumeric, true, right, TType(EbtInt64));

        left = addBinaryMath(EOpSub, left, right, loc);

        TIntermTyped *node = addBinaryMath(EOpDiv, left, size, loc);
        return node;
    }

    // No other math operators supported on references
    if (left->isReference() || right->isReference())
        return nullptr;

    // Try converting the children's base types to compatible types.
    auto children = addPairConversion(op, left, right);
    left = std::get<0>(children);
    right = std::get<1>(children);

    if (left == nullptr || right == nullptr)
        return nullptr;

    // Convert the children's type shape to be compatible.
    addBiShapeConversion(op, left, right);
    if (left == nullptr || right == nullptr)
        return nullptr;

    //
    // Need a new node holding things together.  Make
    // one and promote it to the right type.
    //
    TIntermBinary* node = addBinaryNode(op, left, right, loc);
    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    //
    // If they are both (non-specialization) constants, they must be folded.
    // (Unless it's the sequence (comma) operator, but that's handled in addComma().)
    //
    TIntermConstantUnion *leftTempConstant = node->getLeft()->getAsConstantUnion();
    TIntermConstantUnion *rightTempConstant = node->getRight()->getAsConstantUnion();
    if (leftTempConstant && rightTempConstant) {
        TIntermTyped* folded = leftTempConstant->fold(node->getOp(), rightTempConstant);
        if (folded)
            return folded;
    }

    // If can propagate spec-constantness and if the operation is an allowed
    // specialization-constant operation, make a spec-constant.
    if (specConstantPropagates(*node->getLeft(), *node->getRight()) && isSpecializationOperation(*node))
        node->getWritableType().getQualifier().makeSpecConstant();

    // If must propagate nonuniform, make a nonuniform.
    if ((node->getLeft()->getQualifier().isNonUniform() || node->getRight()->getQualifier().isNonUniform()) &&
            isNonuniformPropagating(node->getOp()))
        node->getWritableType().getQualifier().nonUniform = true;

    return node;
}